

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Poly1305_64.c
# Opt level: O3

void Hacl_Poly1305_64_finish(Hacl_Impl_Poly1305_64_State_poly1305_state st,uint8_t *mac,uint8_t *k1)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong *puVar6;
  
  puVar6 = st.h;
  uVar1 = puVar6[1];
  uVar2 = puVar6[2];
  uVar5 = uVar1 << 0x2c | *puVar6;
  uVar3 = *(ulong *)k1;
  lVar4 = *(long *)(k1 + 8);
  *(ulong *)mac = uVar5 + *(long *)k1;
  *(ulong *)(mac + 8) = (uVar1 >> 0x14 | uVar2 << 0x18) + lVar4 + (ulong)CARRY8(uVar5,uVar3);
  return;
}

Assistant:

void
Hacl_Poly1305_64_finish(
  Hacl_Impl_Poly1305_64_State_poly1305_state st,
  uint8_t *mac,
  uint8_t *k1
)
{
  Hacl_Impl_Poly1305_64_State_poly1305_state scrut = st;
  uint64_t *h = scrut.h;
  uint64_t *acc = h;
  FStar_UInt128_t k_ = load128_le(k1);
  uint64_t h0 = acc[0U];
  uint64_t h1 = acc[1U];
  uint64_t h2 = acc[2U];
  FStar_UInt128_t
  acc_ =
    FStar_UInt128_logor(FStar_UInt128_shift_left(FStar_UInt128_uint64_to_uint128(h2
          << (uint32_t)24U
          | h1 >> (uint32_t)20U),
        (uint32_t)64U),
      FStar_UInt128_uint64_to_uint128(h1 << (uint32_t)44U | h0));
  FStar_UInt128_t mac_ = FStar_UInt128_add_mod(acc_, k_);
  store128_le(mac, mac_);
}